

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O0

void __thiscall wasm::I64ToI32Lowering::visitDrop(I64ToI32Lowering *this,Drop *curr)

{
  bool bVar1;
  TempVar local_38;
  Drop *local_18;
  Drop *curr_local;
  I64ToI32Lowering *this_local;
  
  local_18 = curr;
  curr_local = (Drop *)this;
  bVar1 = hasOutParam(this,curr->value);
  if (bVar1) {
    fetchOutParam(&local_38,this,local_18->value);
    TempVar::~TempVar(&local_38);
  }
  return;
}

Assistant:

void visitDrop(Drop* curr) {
    if (!hasOutParam(curr->value)) {
      return;
    }
    // free temp var
    fetchOutParam(curr->value);
  }